

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Render(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  ImGuiContextHook *pIVar7;
  ImGuiViewportP *pIVar8;
  ImGuiWindow *window;
  ImVec2 IVar9;
  ImGuiContext *pIVar10;
  ImGuiContext *pIVar11;
  ulong uVar12;
  ImDrawList *pIVar13;
  char *__function;
  ImDrawList **ppIVar14;
  ImGuiContext *g;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int n;
  long lVar18;
  ImGuiWindow *pIVar19;
  long lVar20;
  ImGuiWindow *pIVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ImGuiWindow *windows_to_render_top_most [2];
  ImGuiWindow *local_48 [3];
  
  pIVar10 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x1131,"void ImGui::Render()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  pIVar10->FrameCountRendered = pIVar10->FrameCount;
  (pIVar10->IO).MetricsRenderWindows = 0;
  if (0 < (pIVar10->Hooks).Size) {
    lVar18 = 0;
    lVar20 = 0;
    do {
      pIVar7 = (pIVar10->Hooks).Data;
      if (*(int *)(pIVar7 + lVar18 + 4) == 4) {
        (**(code **)(pIVar7 + lVar18 + 0x10))(pIVar10);
      }
      lVar20 = lVar20 + 1;
      lVar18 = lVar18 + 0x20;
    } while (lVar20 < (pIVar10->Hooks).Size);
  }
  uVar5 = (pIVar10->Viewports).Size;
  uVar12 = (ulong)uVar5;
  if (uVar5 != 0) {
    uVar15 = 0;
    do {
      if ((long)(int)uVar12 <= (long)uVar15) {
        __function = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
        goto LAB_0015aa10;
      }
      pIVar8 = (pIVar10->Viewports).Data[uVar15];
      ImDrawDataBuilder::Clear(&pIVar8->DrawDataBuilder);
      if (pIVar8->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar13 = GetViewportDrawList(pIVar8,0,"##Background");
        AddDrawListToDrawData((pIVar8->DrawDataBuilder).Layers,pIVar13);
      }
      uVar15 = uVar15 + 1;
      uVar12 = (ulong)(uint)(pIVar10->Viewports).Size;
    } while (uVar15 != uVar12);
  }
  pIVar21 = pIVar10->NavWindowingTarget;
  if ((pIVar21 == (ImGuiWindow *)0x0) || ((pIVar21->Flags & 0x2000) != 0)) {
    pIVar19 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar19 = pIVar21->RootWindow;
  }
  local_48[0] = pIVar19;
  if (pIVar21 == (ImGuiWindow *)0x0) {
    pIVar21 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar21 = pIVar10->NavWindowingListWindow;
  }
  local_48[1] = pIVar21;
  uVar5 = (pIVar10->Windows).Size;
  uVar12 = (ulong)uVar5;
  if (uVar5 != 0) {
    uVar15 = 0;
    do {
      if ((long)(int)uVar12 <= (long)uVar15) {
        __function = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
LAB_0015aa10:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                      ,0x66a,__function);
      }
      window = (pIVar10->Windows).Data[uVar15];
      if ((window->Active == true) && (window->Hidden == false)) {
        if ((window != pIVar21 && window != pIVar19) && (window->Flags & 0x1000000U) == 0) {
          AddWindowToDrawData(window,(uint)window->Flags >> 0x19 & 1);
        }
      }
      uVar15 = uVar15 + 1;
      uVar12 = (ulong)(uint)(pIVar10->Windows).Size;
    } while (uVar15 != uVar12);
  }
  lVar18 = 0;
  do {
    pIVar21 = local_48[lVar18];
    if (((pIVar21 != (ImGuiWindow *)0x0) && (pIVar21->Active == true)) && (pIVar21->Hidden == false)
       ) {
      AddWindowToDrawData(pIVar21,(uint)pIVar21->Flags >> 0x19 & 1);
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 == 1);
  (pIVar10->IO).MetricsRenderVertices = 0;
  (pIVar10->IO).MetricsRenderIndices = 0;
  if (0 < (pIVar10->Viewports).Size) {
    lVar18 = 0;
    do {
      pIVar8 = (pIVar10->Viewports).Data[lVar18];
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar8->DrawDataBuilder);
      if ((pIVar10->IO).MouseDrawCursor == true) {
        pIVar13 = GetViewportDrawList(pIVar8,1,"##Foreground");
        RenderMouseCursor(pIVar13,(pIVar10->IO).MousePos,(pIVar10->Style).MouseCursorScale,
                          pIVar10->MouseCursor,0xffffffff,0xff000000,0x30000000);
      }
      if (pIVar8->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar13 = GetViewportDrawList(pIVar8,1,"##Foreground");
        AddDrawListToDrawData((pIVar8->DrawDataBuilder).Layers,pIVar13);
      }
      pIVar11 = GImGui;
      if (GImGui == (ImGuiContext *)0x0) {
        __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                      ,0xd3e,"ImGuiIO &ImGui::GetIO()");
      }
      (pIVar8->DrawDataP).Valid = true;
      iVar6 = (pIVar8->DrawDataBuilder).Layers[0].Size;
      if ((long)iVar6 < 1) {
        ppIVar14 = (ImDrawList **)0x0;
      }
      else {
        ppIVar14 = (pIVar8->DrawDataBuilder).Layers[0].Data;
      }
      (pIVar8->DrawDataP).CmdLists = ppIVar14;
      (pIVar8->DrawDataP).CmdListsCount = iVar6;
      (pIVar8->DrawDataP).TotalIdxCount = 0;
      (pIVar8->DrawDataP).TotalVtxCount = 0;
      IVar9 = (pIVar8->super_ImGuiViewport).Size;
      (pIVar8->DrawDataP).DisplayPos = (pIVar8->super_ImGuiViewport).Pos;
      (pIVar8->DrawDataP).DisplaySize = IVar9;
      (pIVar8->DrawDataP).FramebufferScale = (pIVar11->IO).DisplayFramebufferScale;
      if (0 < iVar6) {
        lVar20 = 0;
        iVar16 = 0;
        iVar17 = 0;
        do {
          pIVar13 = (pIVar8->DrawDataBuilder).Layers[0].Data[lVar20];
          iVar17 = iVar17 + (pIVar13->VtxBuffer).Size;
          iVar16 = iVar16 + (pIVar13->IdxBuffer).Size;
          lVar20 = lVar20 + 1;
        } while (iVar6 != lVar20);
        (pIVar8->DrawDataP).TotalVtxCount = iVar17;
        (pIVar8->DrawDataP).TotalIdxCount = iVar16;
      }
      uVar1 = (pIVar8->DrawDataP).TotalIdxCount;
      uVar3 = (pIVar8->DrawDataP).TotalVtxCount;
      auVar22._4_4_ = uVar3;
      auVar22._0_4_ = uVar1;
      auVar22._8_8_ = 0;
      auVar22 = vpshufd_avx(auVar22,0xe1);
      uVar2 = (pIVar10->IO).MetricsRenderVertices;
      uVar4 = (pIVar10->IO).MetricsRenderIndices;
      auVar23._4_4_ = uVar4;
      auVar23._0_4_ = uVar2;
      auVar23._8_8_ = 0;
      auVar22 = vpaddd_avx(auVar23,auVar22);
      (pIVar10->IO).MetricsRenderVertices = (int)auVar22._0_8_;
      (pIVar10->IO).MetricsRenderIndices = (int)((ulong)auVar22._0_8_ >> 0x20);
      lVar18 = lVar18 + 1;
    } while (lVar18 < (pIVar10->Viewports).Size);
  }
  if (0 < (pIVar10->Hooks).Size) {
    lVar18 = 0;
    lVar20 = 0;
    do {
      pIVar7 = (pIVar10->Hooks).Data;
      if (*(int *)(pIVar7 + lVar18 + 4) == 5) {
        (**(code **)(pIVar7 + lVar18 + 0x10))(pIVar10,pIVar7 + lVar18);
      }
      lVar20 = lVar20 + 1;
      lVar18 = lVar18 + 0x20;
    } while (lVar20 < (pIVar10->Hooks).Size);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Draw software mouse cursor if requested by io.MouseDrawCursor flag
        if (g.IO.MouseDrawCursor)
            RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = &viewport->DrawDataP;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}